

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

void __thiscall soul::TaskThread::run(TaskThread *this)

{
  ulong uVar1;
  bool bVar2;
  __int_type _Var3;
  size_type sVar4;
  reference ppQVar5;
  int local_54;
  duration<long,_std::ratio<1L,_1000L>_> local_50 [3];
  int local_34;
  ulong local_30;
  size_t i;
  unique_lock<std::mutex> l;
  bool anyTasksDone;
  TaskThread *this_local;
  
  do {
    _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->shuttingDown);
    if (_Var3 != 0) {
      return;
    }
    l._15_1_ = 0;
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&i,&this->queueLock);
    for (local_30 = 0; uVar1 = local_30,
        sVar4 = std::vector<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>::
                size(&this->queues), uVar1 < sVar4; local_30 = local_30 + 1) {
      _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->shuttingDown);
      if (_Var3 != 0) {
        local_34 = 1;
        goto LAB_005305e9;
      }
      ppQVar5 = std::vector<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>::
                operator[](&this->queues,local_30);
      bVar2 = Queue::serviceNextTask(*ppQVar5);
      if (bVar2) {
        l._15_1_ = 1;
      }
    }
    if ((l._15_1_ & 1) == 0) {
      local_54 = 500;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)local_50,&local_54);
      std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                (&this->checkQueues,(unique_lock<std::mutex> *)&i,local_50);
    }
    local_34 = 0;
LAB_005305e9:
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&i);
    if (local_34 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void run()
    {
        while (! shuttingDown)
        {
            bool anyTasksDone = false;
            std::unique_lock<std::mutex> l (queueLock);

            // NB: avoid iterator because the vector can be modified during the loop
            for (size_t i = 0; i < queues.size(); ++i)
            {
                if (shuttingDown)
                    return;

                if (queues[i]->serviceNextTask())
                    anyTasksDone = true;
            }

            if (! anyTasksDone)
                checkQueues.wait_for (l, std::chrono::milliseconds (500));
        }
    }